

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O3

void FFT(NoiseSuppressionC *self,float *time_data,size_t time_data_length,size_t magnitude_length,
        float *real,float *imag,float *magn)

{
  float fVar1;
  long lVar2;
  
  if ((time_data_length >> 1) + 1 == magnitude_length) {
    WebRtc_rdft(time_data_length,1,time_data,self->ip,self->wfft);
    *imag = 0.0;
    fVar1 = *time_data;
    *real = fVar1;
    *magn = ABS(fVar1) + 1.0;
    imag[magnitude_length - 1] = 0.0;
    fVar1 = time_data[1];
    real[magnitude_length - 1] = fVar1;
    magn[magnitude_length - 1] = ABS(fVar1) + 1.0;
    if (1 < magnitude_length - 1) {
      lVar2 = 0;
      do {
        real[lVar2 + 1] = time_data[lVar2 * 2 + 2];
        fVar1 = time_data[lVar2 * 2 + 3];
        imag[lVar2 + 1] = fVar1;
        magn[lVar2 + 1] = SQRT(real[lVar2 + 1] * real[lVar2 + 1] + fVar1 * fVar1) + 1.0;
        lVar2 = lVar2 + 1;
      } while (magnitude_length - 2 != lVar2);
    }
    return;
  }
  __assert_fail("magnitude_length == time_data_length / 2 + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                ,0x380,
                "void FFT(NoiseSuppressionC *, float *, size_t, size_t, float *, float *, float *)")
  ;
}

Assistant:

static void FFT(NoiseSuppressionC* self,
                float* time_data,
                size_t time_data_length,
                size_t magnitude_length,
                float* real,
                float* imag,
                float* magn) {
  size_t i;

  assert(magnitude_length == time_data_length / 2 + 1);

  WebRtc_rdft(time_data_length, 1, time_data, self->ip, self->wfft);

  imag[0] = 0;
  real[0] = time_data[0];
  magn[0] = fabsf(real[0]) + 1.f;
  imag[magnitude_length - 1] = 0;
  real[magnitude_length - 1] = time_data[1];
  magn[magnitude_length - 1] = fabsf(real[magnitude_length - 1]) + 1.f;
  for (i = 1; i < magnitude_length - 1; ++i) {
    real[i] = time_data[2 * i];
    imag[i] = time_data[2 * i + 1];
    // Magnitude spectrum.
    magn[i] = sqrtf(real[i] * real[i] + imag[i] * imag[i]) + 1.f;
  }
}